

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall wabt::interp::Thread::PushCall(Thread *this,DefinedFunc *func,Ptr *out_trap)

{
  Store *store;
  RunResult RVar1;
  allocator local_69;
  string local_68;
  Ptr local_48;
  
  if ((this->frames_).super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      (this->frames_).super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    store = this->store_;
    std::__cxx11::string::string((string *)&local_68,"call stack exhausted",&local_69);
    Trap::New(&local_48,store,&local_68,&this->frames_);
    out_trap->obj_ = local_48.obj_;
    out_trap->store_ = local_48.store_;
    out_trap->root_index_ = local_48.root_index_;
    local_48.obj_ = (Trap *)0x0;
    local_48.store_ = (Store *)0x0;
    local_48.root_index_ = 0;
    RefPtr<wabt::interp::Trap>::reset(&local_48);
    std::__cxx11::string::_M_dispose();
    RVar1 = Trap;
  }
  else {
    RefPtr<wabt::interp::Instance>::RefPtr
              ((RefPtr<wabt::interp::Instance> *)&local_68,this->store_,(Ref)(func->instance_).index
              );
    this->inst_ = (Instance *)local_68._M_dataplus._M_p;
    RefPtr<wabt::interp::Instance>::reset((RefPtr<wabt::interp::Instance> *)&local_68);
    RefPtr<wabt::interp::Module>::RefPtr
              ((RefPtr<wabt::interp::Module> *)&local_68,this->store_,
               (Ref)(this->inst_->module_).index);
    this->mod_ = (Module *)local_68._M_dataplus._M_p;
    RefPtr<wabt::interp::Module>::reset((RefPtr<wabt::interp::Module> *)&local_68);
    local_68._M_dataplus._M_p = (pointer)(func->super_Func).super_Extern.super_Object.self_.index;
    local_48.obj_ =
         (Trap *)((long)(this->values_).
                        super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->values_).
                        super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4);
    std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>::
    emplace_back<wabt::interp::Ref,unsigned_long,unsigned_int_const&,wabt::interp::Instance*&,wabt::interp::Module*&>
              ((vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>> *)&this->frames_,
               (Ref *)&local_68,(unsigned_long *)&local_48,&(func->desc_).code_offset,&this->inst_,
               &this->mod_);
    RVar1 = Ok;
  }
  return RVar1;
}

Assistant:

RunResult Thread::PushCall(const DefinedFunc& func, Trap::Ptr* out_trap) {
  TRAP_IF(frames_.size() == frames_.capacity(), "call stack exhausted");
  inst_ = store_.UnsafeGet<Instance>(func.instance()).get();
  mod_ = store_.UnsafeGet<Module>(inst_->module()).get();
  frames_.emplace_back(func.self(), values_.size(), func.desc().code_offset,
                       inst_, mod_);
  return RunResult::Ok;
}